

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_decoder.cc
# Opt level: O1

bool __thiscall draco::MetadataDecoder::DecodeEntry(MetadataDecoder *this,Metadata *metadata)

{
  long lVar1;
  DecoderBuffer *pDVar2;
  bool bVar3;
  ulong __n;
  uint32_t data_size;
  vector<unsigned_char,_std::allocator<unsigned_char>_> entry_value;
  string entry_name;
  allocator_type local_6d;
  uint local_6c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_68;
  string local_50;
  
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  bVar3 = DecodeName(this,&local_50);
  if (bVar3) {
    local_6c = 0;
    bVar3 = anon_unknown_7::DecodeVarintUnsigned<unsigned_int>(1,&local_6c,this->buffer_);
    if (((bVar3) && (__n = (ulong)local_6c, __n != 0)) &&
       ((long)__n <= this->buffer_->data_size_ - this->buffer_->pos_)) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_68,__n,&local_6d);
      pDVar2 = this->buffer_;
      lVar1 = pDVar2->pos_ + __n;
      bVar3 = lVar1 <= pDVar2->data_size_;
      if (lVar1 <= pDVar2->data_size_) {
        memcpy(local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start,pDVar2->data_ + pDVar2->pos_,__n);
        pDVar2->pos_ = pDVar2->pos_ + __n;
        Metadata::AddEntryBinary(metadata,&local_50,&local_68);
      }
      if (local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_68.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_68.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      goto LAB_0014de78;
    }
  }
  bVar3 = false;
LAB_0014de78:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  return bVar3;
}

Assistant:

bool MetadataDecoder::DecodeEntry(Metadata *metadata) {
  std::string entry_name;
  if (!DecodeName(&entry_name)) {
    return false;
  }
  uint32_t data_size = 0;
  if (!DecodeVarint(&data_size, buffer_)) {
    return false;
  }
  if (data_size == 0) {
    return false;
  }
  if (data_size > buffer_->remaining_size()) {
    return false;
  }
  std::vector<uint8_t> entry_value(data_size);
  if (!buffer_->Decode(&entry_value[0], data_size)) {
    return false;
  }
  metadata->AddEntryBinary(entry_name, entry_value);
  return true;
}